

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Pointer ft_module_get_service(FT_Module module,char *service_id,FT_Bool global)

{
  FT_Module *ppFVar1;
  FT_Module *limit;
  FT_Module *cur;
  FT_Library library;
  FT_Pointer result;
  FT_Bool global_local;
  char *service_id_local;
  FT_Module module_local;
  
  library = (FT_Library)0x0;
  if (module != (FT_Module)0x0) {
    if (module->clazz->get_interface != (FT_Module_Requester)0x0) {
      library = (FT_Library)(*module->clazz->get_interface)(module,service_id);
    }
    if ((global != '\0') && (library == (FT_Library)0x0)) {
      limit = module->library->modules;
      ppFVar1 = limit + module->library->num_modules;
      while ((limit < ppFVar1 &&
             (((*limit == module || ((*limit)->clazz->get_interface == (FT_Module_Requester)0x0)) ||
              (library = (FT_Library)(*(*limit)->clazz->get_interface)(*limit,service_id),
              library == (FT_Library)0x0))))) {
        limit = limit + 1;
      }
    }
  }
  return library;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_module_get_service( FT_Module    module,
                         const char*  service_id,
                         FT_Bool      global )
  {
    FT_Pointer  result = NULL;


    if ( module )
    {
      FT_ASSERT( module->clazz && module->clazz->get_interface );

      /* first, look for the service in the module */
      if ( module->clazz->get_interface )
        result = module->clazz->get_interface( module, service_id );

      if ( global && !result )
      {
        /* we didn't find it, look in all other modules then */
        FT_Library  library = module->library;
        FT_Module*  cur     = library->modules;
        FT_Module*  limit   = cur + library->num_modules;


        for ( ; cur < limit; cur++ )
        {
          if ( cur[0] != module )
          {
            FT_ASSERT( cur[0]->clazz );

            if ( cur[0]->clazz->get_interface )
            {
              result = cur[0]->clazz->get_interface( cur[0], service_id );
              if ( result )
                break;
            }
          }
        }
      }
    }

    return result;
  }